

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spbcgs_serial.c
# Opt level: O0

int PSolve(void *Data,N_Vector r_vec,N_Vector z_vec,sunrealtype tol,int lr)

{
  int iVar1;
  long lVar2;
  long lVar3;
  void *flagvalue;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  UserData *ProbData;
  sunindextype i;
  sunrealtype *d;
  sunrealtype *z;
  sunrealtype *r;
  int opt;
  char *in_stack_ffffffffffffffb0;
  long lVar4;
  void *in_stack_ffffffffffffffb8;
  int local_4;
  
  lVar2 = N_VGetArrayPointer(in_RSI);
  opt = (int)((ulong)in_RDI >> 0x20);
  iVar1 = check_flag(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,opt);
  if (iVar1 == 0) {
    lVar3 = N_VGetArrayPointer(in_RDX);
    iVar1 = check_flag(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,opt);
    if (iVar1 == 0) {
      flagvalue = (void *)N_VGetArrayPointer(in_RDI[1]);
      iVar1 = check_flag(flagvalue,in_stack_ffffffffffffffb0,opt);
      if (iVar1 == 0) {
        for (lVar4 = 0; lVar4 < *in_RDI; lVar4 = lVar4 + 1) {
          *(double *)(lVar3 + lVar4 * 8) =
               *(double *)(lVar2 + lVar4 * 8) / *(double *)((long)flagvalue + lVar4 * 8);
        }
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int PSolve(void* Data, N_Vector r_vec, N_Vector z_vec, sunrealtype tol, int lr)
{
  /* local variables */
  sunrealtype *r, *z, *d;
  sunindextype i;
  UserData* ProbData;

  /* access user data structure and vector data */
  ProbData = (UserData*)Data;
  r        = N_VGetArrayPointer(r_vec);
  if (check_flag(r, "N_VGetArrayPointer", 0)) { return 1; }
  z = N_VGetArrayPointer(z_vec);
  if (check_flag(z, "N_VGetArrayPointer", 0)) { return 1; }
  d = N_VGetArrayPointer(ProbData->d);
  if (check_flag(d, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate through domain, performing Jacobi solve */
  for (i = 0; i < ProbData->N; i++) { z[i] = r[i] / d[i]; }

  /* return with success */
  return 0;
}